

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseElemModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  bool bVar2;
  pointer pEVar3;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  local_1b8;
  Enum local_1ac;
  Enum local_1a8;
  Type local_1a4;
  Var local_1a0;
  string_view local_158;
  Var local_148;
  Var local_100;
  Enum local_b4;
  Enum local_b0;
  Enum local_ac;
  undefined4 local_a8;
  Enum local_a4;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  local_a0;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_> field
  ;
  string segment_name;
  undefined1 local_70 [7];
  bool has_name;
  string initial_name;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  GetLocation((Location *)local_48,this);
  initial_name.field_2._12_4_ = Expect(this,Elem);
  bVar1 = Failed((Result)initial_name.field_2._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  std::__cxx11::string::string((string *)local_70);
  bVar1 = ParseBindVarOpt(this,(string *)local_70);
  std::__cxx11::string::string((string *)&field,(string *)local_70);
  bVar2 = Features::bulk_memory_enabled(&this->options_->features);
  if (!bVar2) {
    std::__cxx11::string::operator=((string *)&field,"");
  }
  MakeUnique<wabt::ElemSegmentModuleField,wabt::Location&,std::__cxx11::string&>
            ((wabt *)&local_a0,(Location *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field);
  bVar2 = Features::reference_types_enabled(&this->options_->features);
  if ((bVar2) && (bVar2 = Match(this,Declare), bVar2)) {
    pEVar3 = std::
             unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
             ::operator->(&local_a0);
    (pEVar3->elem_segment).kind = Declared;
  }
  bVar2 = Features::bulk_memory_enabled(&this->options_->features);
  if (bVar2) {
    bVar1 = PeekMatchLpar(this,Table);
    if (bVar1) {
      local_a4 = (Enum)Expect(this,Lpar);
      bVar1 = Failed((Result)local_a4);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        goto LAB_002a6b0a;
      }
      local_ac = (Enum)Expect(this,Table);
      bVar1 = Failed((Result)local_ac);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        goto LAB_002a6b0a;
      }
      pEVar3 = std::
               unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
               ::operator->(&local_a0);
      local_b0 = (Enum)ParseVar(this,&(pEVar3->elem_segment).table_var);
      bVar1 = Failed((Result)local_b0);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        goto LAB_002a6b0a;
      }
      local_b4 = (Enum)Expect(this,Rpar);
      bVar1 = Failed((Result)local_b4);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        goto LAB_002a6b0a;
      }
    }
    else {
      pEVar3 = std::
               unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
               ::operator->(&local_a0);
      Var::Var(&local_100,0,(Location *)local_48);
      ParseVarOpt(this,&(pEVar3->elem_segment).table_var,&local_100);
      Var::~Var(&local_100);
    }
  }
  else if (bVar1) {
    string_view::string_view(&local_158,(string *)local_70);
    Var::Var(&local_148,local_158,(Location *)local_48);
    pEVar3 = std::
             unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
             ::operator->(&local_a0);
    Var::operator=(&(pEVar3->elem_segment).table_var,&local_148);
    Var::~Var(&local_148);
  }
  else {
    pEVar3 = std::
             unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
             ::operator->(&local_a0);
    Var::Var(&local_1a0,0,(Location *)local_48);
    ParseVarOpt(this,&(pEVar3->elem_segment).table_var,&local_1a0);
    Var::~Var(&local_1a0);
  }
  pEVar3 = std::
           unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
           ::operator->(&local_a0);
  if ((pEVar3->elem_segment).kind != Declared) {
    pEVar3 = std::
             unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
             ::operator->(&local_a0);
    bVar1 = ParseOffsetExprOpt(this,&(pEVar3->elem_segment).offset);
    if (!bVar1) {
      pEVar3 = std::
               unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
               ::operator->(&local_a0);
      (pEVar3->elem_segment).kind = Passive;
    }
  }
  pEVar3 = std::
           unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
           ::operator->(&local_a0);
  bVar1 = ParseRefTypeOpt(this,&(pEVar3->elem_segment).elem_type);
  if (bVar1) {
    pEVar3 = std::
             unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
             ::operator->(&local_a0);
    ParseElemExprListOpt(this,&(pEVar3->elem_segment).elem_exprs);
  }
  else {
    Type::Type(&local_1a4,Funcref);
    pEVar3 = std::
             unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
             ::operator->(&local_a0);
    (pEVar3->elem_segment).elem_type.enum_ = local_1a4.enum_;
    bVar1 = PeekMatch(this,Func);
    if (bVar1) {
      local_1a8 = (Enum)Expect(this,Func);
      bVar1 = Failed((Result)local_1a8);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        goto LAB_002a6b0a;
      }
    }
    pEVar3 = std::
             unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
             ::operator->(&local_a0);
    ParseElemExprVarListOpt(this,&(pEVar3->elem_segment).elem_exprs);
  }
  local_1ac = (Enum)Expect(this,Rpar);
  bVar1 = Failed((Result)local_1ac);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    std::
    unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>::
    unique_ptr(&local_1b8,&local_a0);
    Module::AppendField(module,&local_1b8);
    std::
    unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>::
    ~unique_ptr(&local_1b8);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
LAB_002a6b0a:
  local_a8 = 1;
  std::unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  ::~unique_ptr(&local_a0);
  std::__cxx11::string::~string((string *)&field);
  std::__cxx11::string::~string((string *)local_70);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseElemModuleField(Module* module) {
  WABT_TRACE(ParseElemModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Elem);

  // With MVP text format the name here was intended to refer to the table
  // that the elem segment was part of, but we never did anything with this name
  // since there was only one table anyway.
  // With bulk-memory enabled this introduces a new name for the particular
  // elem segment.
  std::string initial_name;
  bool has_name = ParseBindVarOpt(&initial_name);

  std::string segment_name = initial_name;
  if (!options_->features.bulk_memory_enabled()) {
    segment_name = "";
  }
  auto field = MakeUnique<ElemSegmentModuleField>(loc, segment_name);
  if (options_->features.reference_types_enabled() &&
      Match(TokenType::Declare)) {
    field->elem_segment.kind = SegmentKind::Declared;
  }

  // Optional table specifier
  if (options_->features.bulk_memory_enabled()) {
    if (PeekMatchLpar(TokenType::Table)) {
      EXPECT(Lpar);
      EXPECT(Table);
      CHECK_RESULT(ParseVar(&field->elem_segment.table_var));
      EXPECT(Rpar);
    } else {
      ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    }
  } else {
    if (has_name) {
      field->elem_segment.table_var = Var(initial_name, loc);
    } else {
      ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    }
  }

  if ((field->elem_segment.kind != SegmentKind::Declared) &&
      !ParseOffsetExprOpt(&field->elem_segment.offset)) {
    field->elem_segment.kind = SegmentKind::Passive;
  }

  if (ParseRefTypeOpt(&field->elem_segment.elem_type)) {
    ParseElemExprListOpt(&field->elem_segment.elem_exprs);
  } else {
    field->elem_segment.elem_type = Type::Funcref;
    if (PeekMatch(TokenType::Func)) {
      EXPECT(Func);
    }
    ParseElemExprVarListOpt(&field->elem_segment.elem_exprs);
  }
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}